

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# airport.cpp
# Opt level: O2

void __thiscall
Airport::Airport(Airport *this,
                map<unsigned_int,_Ticket,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Ticket>_>_>
                *tickets,uint runway_strips,string *name)

{
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Ticket>,_std::_Select1st<std::pair<const_unsigned_int,_Ticket>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Ticket>_>_>
  ::_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Ticket>,_std::_Select1st<std::pair<const_unsigned_int,_Ticket>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Ticket>_>_>
              *)this,&tickets->_M_t);
  this->runway_strips = runway_strips;
  std::__cxx11::string::string((string *)&this->name,name);
  return;
}

Assistant:

Airport::Airport(std::map<unsigned,Ticket> tickets, unsigned runway_strips, string name)
: tickets(tickets), runway_strips(runway_strips), name(name){}